

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O1

ssize_t readn(int fd,string *inBuffer,bool *zero)

{
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  ssize_t sVar4;
  undefined1 local_1078 [8];
  char buff [4096];
  undefined1 local_68 [16];
  string *local_58;
  bool *local_50;
  long local_48;
  long local_40;
  undefined8 local_38;
  
  local_40 = 1;
  local_48 = 3;
  local_58 = inBuffer;
  local_50 = zero;
  sVar2 = read(fd,local_1078,0x1000);
  if (sVar2 < 0) {
    piVar3 = __errno_location();
    uVar1 = 2;
    if (*piVar3 != 4) {
      if (*piVar3 == 0xb) {
        local_38 = 0;
        sVar4 = (*(code *)((long)&DAT_00111fec + (long)(int)(&DAT_00111fec)[local_40]))();
        return sVar4;
      }
      perror("read error");
      local_38 = 0xffffffffffffffff;
      sVar4 = (*(code *)((long)&DAT_00111fec + (long)(int)(&DAT_00111fec)[local_40]))();
      return sVar4;
    }
  }
  else {
    if (sVar2 == 0) {
      *local_50 = true;
      sVar4 = (*(code *)((long)&DAT_00111fec + (long)(int)(&DAT_00111fec)[local_48]))();
      return sVar4;
    }
    buff._4088_8_ = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(buff + 0xff8),local_1078,local_1078 + sVar2);
    std::__cxx11::string::_M_append((char *)local_58,buff._4088_8_);
    if ((undefined1 *)buff._4088_8_ != local_68) {
      operator_delete((void *)buff._4088_8_);
    }
    uVar1 = 0;
  }
  sVar4 = (*(code *)((long)&DAT_00111fec + (long)(int)(&DAT_00111fec)[uVar1]))();
  return sVar4;
}

Assistant:

ssize_t readn(int fd, std::string &inBuffer, bool &zero) {
  ssize_t nread = 0;
  ssize_t readSum = 0;
  while (true) {
    char buff[MAX_BUFF];
    if ((nread = read(fd, buff, MAX_BUFF)) < 0) {
      if (errno == EINTR)
        continue;
      else if (errno == EAGAIN) {
        return readSum;
      } else {
        perror("read error");
        return -1;
      }
    } else if (nread == 0) {
      // printf("redsum = %d\n", readSum);
      zero = true;
      break;
    }
    // printf("before inBuffer.size() = %d\n", inBuffer.size());
    // printf("nread = %d\n", nread);
    readSum += nread;
    // buff += nread;
    inBuffer += std::string(buff, buff + nread);
    // printf("after inBuffer.size() = %d\n", inBuffer.size());
  }
  return readSum;
}